

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ScopedMessage::~ScopedMessage(ScopedMessage *this)

{
  MessageInfo *this_00;
  undefined8 in_RDI;
  
  this_00 = (MessageInfo *)getResultCapture();
  (*(*(_func_int ***)this_00)[7])(this_00,in_RDI);
  MessageInfo::~MessageInfo(this_00);
  return;
}

Assistant:

ScopedMessage::~ScopedMessage() {
        getResultCapture().popScopedMessage( m_info );
    }